

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

_Bool AutoMove(void)

{
  _Bool _Var1;
  int local_1c;
  int local_18;
  int i_2;
  int i_1;
  int j;
  int i;
  
  i_1 = 0;
  do {
    if (6 < i_1) {
      for (local_18 = 0; local_18 < 7; local_18 = local_18 + 1) {
        _Var1 = tbl_MovePackToDesk(local_18);
        if (_Var1) {
          return true;
        }
      }
      local_1c = 0;
      while( true ) {
        if (6 < local_1c) {
          _Var1 = tbl_MovePackToColors();
          return _Var1;
        }
        _Var1 = tbl_MoveDeskToColors(local_1c);
        if (_Var1) break;
        local_1c = local_1c + 1;
      }
      return true;
    }
    for (i_2 = 0; i_2 < 7; i_2 = i_2 + 1) {
      if (((i_1 != i_2) && (_Var1 = tbl_IsRevealingDeskMove(i_1,i_2), _Var1)) &&
         (_Var1 = tbl_MoveDeskToDesk(i_1,i_2), _Var1)) {
        return true;
      }
    }
    i_1 = i_1 + 1;
  } while( true );
}

Assistant:

static bool AutoMove(void)
{
  // try to move cards between desk stacks
  for (int i = 0; i < NUM_STACKS; i++) {
    for (int j = 0; j < NUM_STACKS; j++) {
      if ((i != j) && tbl_IsRevealingDeskMove(i, j) &&
          tbl_MoveDeskToDesk(i, j)) {
        return true;
      }
    }
  }

  // try to move the pack card to any desk stack
  for (int i = 0; i < NUM_STACKS; i++) {
    if (tbl_MovePackToDesk(i)) {
      return true;
    }
  }

  // try to move any desk card to colors
  for (int i = 0; i < NUM_STACKS; i++) {
    if (tbl_MoveDeskToColors(i)) {
      return true;
    }
  }

  // try to move the pack card to colors
  if (tbl_MovePackToColors()) {
    return true;
  }

#ifdef TURBO
  // if everything else fails, draw next card
  tbl_DrawNextCard();
  return true;
#else
  return false;
#endif
}